

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall Loop::RemoveBreakBlocks(Loop *this,FlowGraph *fg)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Type *ppBVar5;
  BasicBlock *pBVar6;
  Type pBVar7;
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Type blockEnd;
  BasicBlock *this_00;
  Iterator local_48;
  Type local_38;
  
  sourceContextId = Func::GetSourceContextId(fg->func);
  functionId = Func::GetLocalFunctionId(fg->func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,RemoveBreakBlockPhase,sourceContextId,functionId);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    pSVar8 = &(this->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>;
    local_48.list = pSVar8;
    local_48.current = &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pBVar7 = (Type)0x0;
    while( true ) {
      if (pSVar8 == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_003fa538;
        *puVar4 = 0;
        pSVar8 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      }
      pSVar8 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
               (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>)->
               super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar8 == local_48.list) break;
      local_48.current = (NodeBase *)pSVar8;
      ppBVar5 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          (&local_48);
      pSVar8 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
      if (((*ppBVar5)->field_0x18 & 1) == 0) {
        pBVar7 = *ppBVar5;
      }
    }
    if (pBVar7 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x412,"(loopTailBlock)","loopTailBlock");
      if (!bVar2) {
LAB_003fa538:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pBVar6 = GetHeadBlock(this);
    if (pBVar6 == (BasicBlock *)0x0) {
      local_38 = (Type)0x0;
    }
    else {
      pBVar6 = GetHeadBlock(this);
      local_38 = pBVar6->prev;
    }
    bVar2 = false;
    pBVar6 = pBVar7;
    while (blockEnd = pBVar6, blockEnd != local_38) {
      pBVar6 = blockEnd->prev;
      if ((blockEnd->field_0x18 & 1) == 0) {
        while (bVar3 = IsDescendentOrSelf(this,blockEnd->loop), !bVar3) {
          blockEnd->field_0x19 = blockEnd->field_0x19 | 1;
          pBVar6 = blockEnd;
          do {
            do {
              this_00 = pBVar6;
              pBVar6 = BasicBlock::GetPrev(this_00);
            } while (pBVar6->loop == blockEnd->loop);
            bVar2 = IsDescendentOrSelf(this,pBVar6->loop);
          } while (!bVar2);
          this_00->field_0x19 = this_00->field_0x19 | 1;
          FlowGraph::MoveBlocksBefore(fg,this_00,blockEnd,pBVar7->next);
          FlowGraph::Dump(fg,true,L"\n After Each iteration of canonicalization \n");
          pBVar6 = pBVar7->prev;
          bVar2 = true;
          blockEnd = pBVar7;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool
Loop::RemoveBreakBlocks(FlowGraph *fg)
{
    bool breakBlockRelocated = false;
    if (PHASE_OFF(Js::RemoveBreakBlockPhase, fg->GetFunc()))
    {
        return false;
    }

    BasicBlock *loopTailBlock = nullptr;
    FOREACH_BLOCK_IN_LOOP(block, this)
    {
        loopTailBlock = block;
    }NEXT_BLOCK_IN_LOOP;

    AnalysisAssert(loopTailBlock);

    FOREACH_BLOCK_BACKWARD_IN_RANGE_EDITING(breakBlockEnd, loopTailBlock, this->GetHeadBlock(), blockPrev)
    {
        while (!this->IsDescendentOrSelf(breakBlockEnd->loop))
        {
            // Found at least one break block;
            breakBlockRelocated = true;

#if DBG
            breakBlockEnd->isBreakBlock = true;
#endif
            // Find the first block in this break block sequence.
            BasicBlock *breakBlockStart = breakBlockEnd;
            BasicBlock *breakBlockStartPrev = breakBlockEnd->GetPrev();

            // Walk back the blocks until we find a block which belongs to that block.
            // Note: We don't really care if there are break blocks corresponding to different loops. We move the blocks conservatively to the end of the loop.

            // Algorithm works on one loop at a time.
            while((breakBlockStartPrev->loop == breakBlockEnd->loop) || !this->IsDescendentOrSelf(breakBlockStartPrev->loop))
            {
                breakBlockStart = breakBlockStartPrev;
                breakBlockStartPrev = breakBlockStartPrev->GetPrev();
            }

#if DBG
            breakBlockStart->isBreakBlock = true; // Mark the first block as well.
#endif

            BasicBlock *exitLoopTail = loopTailBlock;
            // Move these break blocks to the tail of the loop.
            fg->MoveBlocksBefore(breakBlockStart, breakBlockEnd, exitLoopTail->next);

#if DBG_DUMP
            fg->Dump(true /*needs verbose flag*/, _u("\n After Each iteration of canonicalization \n"));
#endif
            // Again be conservative, there are edits to the loop graph. Start fresh for this loop.
            breakBlockEnd = loopTailBlock;
            blockPrev = breakBlockEnd->prev;
        }
    } NEXT_BLOCK_BACKWARD_IN_RANGE_EDITING;

    return breakBlockRelocated;
}